

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.cpp
# Opt level: O0

void Diligent::ValidatePSOCreateInfo<Diligent::ComputePipelineStateCreateInfo>
               (IRenderDevice *pDevice,ComputePipelineStateCreateInfo *CreateInfo)

{
  Char *Message;
  char (*in_RCX) [19];
  undefined1 local_38 [8];
  string msg;
  ComputePipelineStateCreateInfo *CreateInfo_local;
  IRenderDevice *pDevice_local;
  
  msg.field_2._8_8_ = CreateInfo;
  if (pDevice == (IRenderDevice *)0x0) {
    FormatString<char[26],char[19]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",(char (*) [26])0xcc143e,
               in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"ValidatePSOCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x3b6);
    std::__cxx11::string::~string((string *)local_38);
  }
  anon_unknown_61::ValidateComputePipelineCreateInfo
            ((ComputePipelineStateCreateInfo *)msg.field_2._8_8_,pDevice);
  return;
}

Assistant:

void ValidatePSOCreateInfo<ComputePipelineStateCreateInfo>(const IRenderDevice*                  pDevice,
                                                           const ComputePipelineStateCreateInfo& CreateInfo) noexcept(false)
{
    VERIFY_EXPR(pDevice != nullptr);
    ValidateComputePipelineCreateInfo(CreateInfo, pDevice);
}